

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

bool __thiscall
HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>
::
insert<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>>
          (HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>
           *this,HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                 *args)

{
  undefined8 *puVar1;
  byte bVar2;
  u8 uVar3;
  long lVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer pSVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_41;
  ulong local_40;
  KeyType local_38;
  ulong local_20;
  ulong local_18;
  
  local_38.
  super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (args->value_).
       super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (args->value_).
       super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (args->value_).
       super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->value_).
  super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args->value_).
  super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->value_).
  super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar8 = HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
          ::findPosition((HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                          *)this,&local_38,&local_41,&local_18,&local_20,&local_40);
  if (bVar8) {
    bVar8 = false;
  }
  else {
    uVar9 = *(ulong *)(this + 0x10);
    if ((*(ulong *)(this + 0x20) == uVar9 * 7 + 7 >> 3) || (local_40 == local_20)) {
      HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
      ::growTable((HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                   *)this);
      bVar8 = insert<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>>
                        (this,(HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                               *)&local_38);
    }
    else {
      lVar4 = *(long *)this;
      *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
      uVar10 = local_20;
      do {
        bVar2 = *(byte *)(*(long *)(this + 8) + local_40);
        if (-1 < (char)bVar2) {
          *(u8 *)(*(long *)(this + 8) + local_40) = local_41;
          puVar1 = (undefined8 *)(lVar4 + local_40 * 0x18);
          *puVar1 = local_38.
                    super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1[1] = local_38.
                      super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)(lVar4 + 0x10 + local_40 * 0x18) =
               local_38.
               super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          return true;
        }
        uVar11 = (ulong)((int)local_40 - (uint)bVar2 & 0x7f);
        if (uVar11 < (local_40 - local_18 & uVar9)) {
          puVar1 = (undefined8 *)(lVar4 + local_40 * 0x18);
          pSVar6 = (pointer)*puVar1;
          pSVar7 = (pointer)puVar1[1];
          pSVar5 = *(pointer *)(lVar4 + 0x10 + local_40 * 0x18);
          puVar1 = (undefined8 *)(lVar4 + local_40 * 0x18);
          *puVar1 = local_38.
                    super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1[1] = local_38.
                      super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)(lVar4 + 0x10 + local_40 * 0x18) =
               local_38.
               super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar3 = *(u8 *)(*(long *)(this + 8) + local_40);
          *(u8 *)(*(long *)(this + 8) + local_40) = local_41;
          uVar9 = *(ulong *)(this + 0x10);
          local_18 = local_40 - uVar11 & uVar9;
          uVar10 = local_18 + 0x7f & uVar9;
          local_41 = uVar3;
          local_38.
          super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
          ._M_impl.super__Vector_impl_data._M_start = pSVar6;
          local_38.
          super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar7;
          local_38.
          super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar5;
          local_20 = uVar10;
        }
        local_40 = local_40 + 1 & uVar9;
      } while (local_40 != uVar10);
      HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
      ::growTable((HighsHashTable<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                   *)this);
      bVar8 = true;
      insert<HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>,void>>
                (this,(HighsHashTableEntry<std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>,_void>
                       *)&local_38);
    }
  }
  if (local_38.
      super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }